

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase34::run(TestCase34 *this)

{
  int iVar1;
  undefined3 *__nbytes;
  FdOutputStream out;
  FdInputStream in;
  int fds [2];
  OwnFd local_e0;
  OwnFd local_dc;
  ArrayPtr<unsigned_char> local_d8;
  ArrayPtr<const_unsigned_char> local_c8;
  byte buf [6];
  DebugComparison<kj::ArrayPtr<const_unsigned_char>,_kj::ArrayPtr<unsigned_char>_> _kjCondition;
  Fault f;
  
  fds[0] = 0;
  fds[1] = 0;
  do {
    iVar1 = pipe(fds);
    if (-1 < iVar1) goto LAB_00181755;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io-test.c++"
               ,0x27,iVar1,"miniposix::pipe(fds)","");
    _::Debug::Fault::fatal(&f);
  }
LAB_00181755:
  in.super_InputStream._vptr_InputStream = (_func_int **)&PTR__FdInputStream_0021e700;
  in.fd = fds[0];
  in.autoclose.fd = fds[0];
  local_dc.fd = -1;
  OwnFd::~OwnFd(&local_dc);
  out.super_OutputStream._vptr_OutputStream = (_func_int **)&PTR__FdOutputStream_0021e730;
  out.fd = fds[1];
  out.autoclose.fd = fds[1];
  local_e0.fd = -1;
  OwnFd::~OwnFd(&local_e0);
  f.exception = (Exception *)0x0;
  __nbytes = &_::ByteLiteral<4ul>;
  FdOutputStream::write(&out,(int)&f,(void *)0x5,0x1bff38);
  buf[4] = '\0';
  buf[5] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  InputStream::read(&in.super_InputStream,(int)buf,(void *)0x6,(size_t)__nbytes);
  local_c8.ptr = 
  "foobar/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
  ;
  local_c8.size_ = 6;
  local_d8.size_ = 6;
  local_d8.ptr = buf;
  _::DebugExpression<kj::ArrayPtr<unsigned_char_const>>::operator==
            (&_kjCondition,(DebugExpression<kj::ArrayPtr<unsigned_char_const>> *)&local_c8,&local_d8
            );
  if ((_kjCondition.result == false) && (_::Debug::minSeverity < 3)) {
    local_c8.ptr = 
    "foobar/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
    ;
    local_c8.size_ = 6;
    local_d8.size_ = 6;
    local_d8.ptr = buf;
    _::Debug::
    log<char_const(&)[51],kj::_::DebugComparison<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char>>&,kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char>>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io-test.c++"
               ,0x38,ERROR,
               "\"failed: expected \" \"(\\\"foobar\\\"_kjb) == (arrayPtr(buf))\", _kjCondition, \"foobar\"_kjb, arrayPtr(buf)"
               ,(char (*) [51])"failed: expected (\"foobar\"_kjb) == (arrayPtr(buf))",&_kjCondition,
               &local_c8,&local_d8);
  }
  FdOutputStream::~FdOutputStream(&out);
  FdInputStream::~FdInputStream(&in);
  return;
}

Assistant:

TEST(Io, WriteVec) {
  // Check that writing an array of arrays works even when some of the arrays are empty.  (This
  // used to not work in some cases.)

  int fds[2]{};
  KJ_SYSCALL(miniposix::pipe(fds));

  FdInputStream in((OwnFd(fds[0])));
  FdOutputStream out((OwnFd(fds[1])));

  ArrayPtr<const byte> pieces[5] = {
    arrayPtr(implicitCast<const byte*>(nullptr), 0),
    "foo"_kjb,
    arrayPtr(implicitCast<const byte*>(nullptr), 0),
    "bar"_kjb,
    arrayPtr(implicitCast<const byte*>(nullptr), 0)
  };

  out.write(pieces);

  byte buf[6]{};
  in.read(buf);
  EXPECT_EQ("foobar"_kjb, arrayPtr(buf));
}